

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  cdataBlockSAXFunc p_Var9;
  int iVar10;
  xmlChar xVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int l;
  int sl;
  int rl;
  char *msg;
  xmlChar *pxVar17;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  iVar15 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar15 = 10000000;
  }
  pxVar5 = ctxt->input;
  pxVar6 = pxVar5->cur;
  if (*pxVar6 != '<') {
    return;
  }
  if (pxVar6[1] != '!') {
    return;
  }
  if (pxVar6[2] != '[') {
    return;
  }
  pxVar7 = pxVar6 + 3;
  pxVar5->cur = pxVar7;
  pxVar5->col = pxVar5->col + 3;
  xVar11 = pxVar6[3];
  if (xVar11 == '\0') {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
    pxVar7 = pxVar5->cur;
    xVar11 = *pxVar7;
  }
  if (xVar11 != 'C') {
    return;
  }
  if (pxVar7[1] != 'D') {
    return;
  }
  if (pxVar7[2] != 'A') {
    return;
  }
  if (pxVar7[3] != 'T') {
    return;
  }
  if (pxVar7[4] != 'A') {
    return;
  }
  if (pxVar7[5] != '[') {
    return;
  }
  pxVar5->cur = pxVar7 + 6;
  pxVar5->col = pxVar5->col + 6;
  if (pxVar7[6] == '\0') {
    xmlParserGrow(ctxt);
  }
  uVar3 = xmlCurrentChar(ctxt,&local_44);
  uVar14 = 0xfffd;
  if (uVar3 != 0x200000) {
    uVar14 = (ulong)uVar3;
  }
  uVar3 = (uint)uVar14;
  if ((int)uVar3 < 0x100) {
    if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_0013967b:
      pxVar5 = ctxt->input;
      if (*pxVar5->cur == '\n') {
        pxVar5->line = pxVar5->line + 1;
        pxVar5->col = 1;
      }
      else {
        pxVar5->col = pxVar5->col + 1;
      }
      pxVar5->cur = pxVar5->cur + local_44;
      uVar3 = xmlCurrentChar(ctxt,&local_48);
      uVar16 = 0xfffd;
      if (uVar3 != 0x200000) {
        uVar16 = (ulong)uVar3;
      }
      uVar3 = (uint)uVar16;
      if ((int)uVar3 < 0x100) {
        if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_001396df:
          pxVar5 = ctxt->input;
          if (*pxVar5->cur == '\n') {
            pxVar5->line = pxVar5->line + 1;
            pxVar5->col = 1;
          }
          else {
            pxVar5->col = pxVar5->col + 1;
          }
          pxVar5->cur = pxVar5->cur + local_48;
          uVar3 = xmlCurrentChar(ctxt,&local_4c);
          pxVar6 = (xmlChar *)(*xmlMalloc)(100);
          if (pxVar6 != (xmlChar *)0x0) {
            iVar10 = 0;
            iVar12 = 100;
            local_38 = uVar14;
            do {
              uVar14 = (ulong)uVar3;
              if (uVar3 == 0x200000) {
                uVar14 = 0xfffd;
              }
              uVar3 = (uint)uVar14;
              if (0xff < (int)uVar3) {
                if (uVar3 - 0x10000 < 0x100000 || (uVar3 - 0xe000 < 0x1ffe || uVar3 < 0xd800))
                goto LAB_0013981a;
LAB_00139911:
                pxVar6[iVar10] = '\0';
                msg = "CData section not finished\n%.50s\n";
                pxVar7 = pxVar6;
                pxVar17 = pxVar6;
LAB_001399a1:
                local_38 = uVar16;
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_CDATA_NOT_FINISHED,
                           XML_ERR_FATAL,pxVar7,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,pxVar17);
                goto LAB_001399a8;
              }
              if ((int)uVar3 < 0x20) {
                if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00139911;
              }
              else if (uVar3 == 0x3e && ((int)uVar16 == 0x5d && (int)local_38 == 0x5d)) {
                pxVar6[iVar10] = '\0';
                pxVar5 = ctxt->input;
                if (*pxVar5->cur == '\n') {
                  pxVar5->line = pxVar5->line + 1;
                  pxVar5->col = 1;
                }
                else {
                  pxVar5->col = pxVar5->col + 1;
                }
                pxVar5->cur = pxVar5->cur + local_4c;
                p_Var1 = ctxt->sax;
                local_38 = uVar16;
                if ((p_Var1 != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
                  if ((ctxt->options & 0x4000) == 0) {
                    p_Var9 = p_Var1->cdataBlock;
                  }
                  else {
                    p_Var9 = p_Var1->characters;
                  }
                  if (p_Var9 != (cdataBlockSAXFunc)0x0) {
                    (*p_Var9)(ctxt->userData,pxVar6,iVar10);
                  }
                }
                goto LAB_001399a8;
              }
LAB_0013981a:
              pxVar7 = pxVar6;
              uVar13 = local_38;
              if (iVar12 <= iVar10 + 5) {
                local_40 = local_38;
                if (iVar12 < 1) {
                  iVar12 = 1;
                }
                else {
                  if (iVar15 <= iVar12) {
                    msg = "%s";
                    pxVar7 = (xmlChar *)0x0;
                    pxVar17 = (xmlChar *)"CData section too big found\n";
                    goto LAB_001399a1;
                  }
                  uVar3 = iVar12 + 1U >> 1;
                  bVar2 = (int)(iVar15 - uVar3) < iVar12;
                  iVar12 = uVar3 + iVar12;
                  if (bVar2) {
                    iVar12 = iVar15;
                  }
                }
                local_38 = uVar16;
                pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)iVar12);
                uVar13 = local_40;
                uVar16 = local_38;
                if (pxVar7 == (xmlChar *)0x0) goto LAB_00139955;
              }
              local_38 = uVar16;
              if ((uint)uVar13 < 0x80) {
                lVar8 = (long)iVar10;
                iVar10 = iVar10 + 1;
                pxVar7[lVar8] = (xmlChar)uVar13;
              }
              else {
                iVar4 = xmlCopyCharMultiByte(pxVar7 + iVar10,(uint)uVar13);
                iVar10 = iVar4 + iVar10;
              }
              local_44 = local_48;
              local_48 = local_4c;
              pxVar5 = ctxt->input;
              if (*pxVar5->cur == '\n') {
                pxVar5->line = pxVar5->line + 1;
                pxVar5->col = 1;
              }
              else {
                pxVar5->col = pxVar5->col + 1;
              }
              pxVar5->cur = pxVar5->cur + local_4c;
              uVar3 = xmlCurrentChar(ctxt,&local_4c);
              uVar16 = uVar14;
              pxVar6 = pxVar7;
            } while( true );
          }
          xmlCtxtErrMemory(ctxt);
          pxVar6 = (xmlChar *)0x0;
          goto LAB_001399a8;
        }
      }
      else if (uVar3 - 0x10000 < 0x100000 || (uVar3 - 0xe000 < 0x1ffe || uVar3 < 0xd800))
      goto LAB_001396df;
    }
  }
  else if (uVar3 - 0x10000 < 0x100000 || (uVar3 - 0xe000 < 0x1ffe || uVar3 < 0xd800))
  goto LAB_0013967b;
  pxVar6 = (xmlChar *)0x0;
  xmlFatalErr(ctxt,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
LAB_001399a8:
  (*xmlFree)(pxVar6);
  return;
LAB_00139955:
  xmlCtxtErrMemory(ctxt);
  goto LAB_001399a8;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if ((CUR != '<') || (NXT(1) != '!') || (NXT(2) != '['))
        return;
    SKIP(3);

    if (!CMP6(CUR_PTR, 'C', 'D', 'A', 'T', 'A', '['))
        return;
    SKIP(6);

    r = xmlCurrentCharRecover(ctxt, &rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(rl);
    s = xmlCurrentCharRecover(ctxt, &sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(sl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
        goto out;
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsg(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                               "CData section too big found\n");
                goto out;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
                goto out;
	    }
	    buf = tmp;
	    size = newSize;
	}
	COPY_BUF(buf, len, r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
        goto out;
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        if (ctxt->options & XML_PARSE_NOCDATA) {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, len);
        } else {
            if (ctxt->sax->cdataBlock != NULL)
                ctxt->sax->cdataBlock(ctxt->userData, buf, len);
        }
    }

out:
    xmlFree(buf);
}